

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

void __thiscall raft_functional_common::TestMgr::save_state(TestMgr *this,srv_state *state)

{
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  ptr<buffer> buf;
  srv_state *in_stack_ffffffffffffffa8;
  buffer *buf_00;
  buffer local_20 [32];
  
  buf_00 = local_20;
  nuraft::srv_state::serialize(in_stack_ffffffffffffffa8);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_RDI);
  nuraft::srv_state::deserialize(buf_00);
  std::shared_ptr<nuraft::srv_state>::operator=
            ((shared_ptr<nuraft::srv_state> *)in_RDI,
             (shared_ptr<nuraft::srv_state> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<nuraft::srv_state>::~shared_ptr((shared_ptr<nuraft::srv_state> *)0x190b82);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x190b8c);
  return;
}

Assistant:

void save_state(const srv_state& state) {
        ptr<buffer> buf = state.serialize();
        savedState = srv_state::deserialize(*buf);
    }